

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_config.cc
# Opt level: O1

void MessageCallback(int is_write,int version,int content_type,void *buf,size_t len,SSL *ssl,
                    void *arg)

{
  int iVar1;
  void *pvVar2;
  TestState *pTVar3;
  ulong uVar4;
  char *__format;
  uint8_t type;
  uint32_t msg_len;
  CBS cbs;
  char text [16];
  char text_1 [16];
  byte local_81;
  bool *local_80;
  string *local_78;
  int local_70;
  uint local_6c;
  CBS local_68;
  char local_58 [16];
  char local_48 [24];
  
  local_70 = is_write;
  iVar1 = TestConfigExDataIndex();
  pvVar2 = SSL_get_ex_data((SSL *)ssl,iVar1);
  pTVar3 = GetTestState(ssl);
  if (pTVar3->msg_callback_ok != true) {
    return;
  }
  if (content_type == 0x100) {
    if (*(char *)((long)pvVar2 + 0x11) != '\x01') {
      if (len == 5) {
        return;
      }
      fprintf(_stderr,"Incorrect length for record header: %zu.\n",len);
      pTVar3->msg_callback_ok = false;
      return;
    }
    if (len < 0xe) {
      return;
    }
    fprintf(_stderr,"DTLS record header is too long: %zu.\n",len);
    return;
  }
  local_78 = &pTVar3->msg_callback_text;
  local_80 = &pTVar3->msg_callback_ok;
  std::__cxx11::string::append((char *)local_78);
  switch(content_type) {
  case 0x14:
    if ((len != 1) || (*buf != '\x01')) {
      MessageCallback();
      return;
    }
    break;
  case 0x15:
    if (len != 2) {
      MessageCallback();
      return;
    }
    snprintf(local_58,0x10,"alert %d %d\n",(ulong)*buf,(ulong)*(byte *)((long)buf + 1));
    goto LAB_00129e6f;
  case 0x17:
  case 0x18:
  case 0x19:
switchD_00129d09_caseD_17:
    __format = "Invalid content_type: %d.\n";
    uVar4 = (ulong)(uint)content_type;
LAB_00129f05:
    fprintf(_stderr,__format,uVar4);
    *local_80 = false;
    return;
  case 0x1a:
    break;
  default:
    if (content_type != 0x101) {
      if (content_type == 0) {
        if (version == 2) break;
        __format = "Incorrect version for V2ClientHello: %x.\n";
        uVar4 = (ulong)(uint)version;
        goto LAB_00129f05;
      }
      goto switchD_00129d09_caseD_17;
    }
  case 0x16:
    local_68.data = (uint8_t *)buf;
    local_68.len = len;
    iVar1 = CBS_get_u8(&local_68,&local_81);
    if ((iVar1 == 0) ||
       ((((*(char *)((long)pvVar2 + 0x11) == '\x01' && (iVar1 = CBS_skip(&local_68,8), iVar1 == 0))
         || (iVar1 = CBS_get_u24(&local_68,&local_6c), iVar1 == 0)) ||
        ((iVar1 = CBS_skip(&local_68,(ulong)local_6c), iVar1 == 0 || (local_68.len != 0)))))) {
      MessageCallback();
    }
    else if (content_type == 0x101) {
      if (local_81 == 1) {
LAB_00129e6f:
        std::__cxx11::string::append((char *)local_78);
      }
      else {
        MessageCallback();
      }
    }
    else {
      snprintf(local_48,0x10,"hs %d\n");
      std::__cxx11::string::append((char *)local_78);
      if (local_70 == 0) {
        pTVar3->last_message_received = (uint)local_81;
      }
    }
    return;
  }
  std::__cxx11::string::append((char *)local_78);
  return;
}

Assistant:

static void MessageCallback(int is_write, int version, int content_type,
                            const void *buf, size_t len, SSL *ssl, void *arg) {
  const uint8_t *buf_u8 = reinterpret_cast<const uint8_t *>(buf);
  const TestConfig *config = GetTestConfig(ssl);
  TestState *state = GetTestState(ssl);
  if (!state->msg_callback_ok) {
    return;
  }

  if (content_type == SSL3_RT_HEADER) {
    if (config->is_dtls) {
      // Starting DTLS 1.3, record headers are variable-length, but they will
      // not be longer than DTLS 1.2's 13-byte header.
      if (len > 13) {
        fprintf(stderr, "DTLS record header is too long: %zu.\n", len);
      }
      return;
    }
    if (len != SSL3_RT_HEADER_LENGTH) {
      fprintf(stderr, "Incorrect length for record header: %zu.\n", len);
      state->msg_callback_ok = false;
    }
    return;
  }

  state->msg_callback_text += is_write ? "write " : "read ";
  switch (content_type) {
    case 0:
      if (version != SSL2_VERSION) {
        fprintf(stderr, "Incorrect version for V2ClientHello: %x.\n",
                static_cast<unsigned>(version));
        state->msg_callback_ok = false;
        return;
      }
      state->msg_callback_text += "v2clienthello\n";
      return;

    case SSL3_RT_CLIENT_HELLO_INNER:
    case SSL3_RT_HANDSHAKE: {
      CBS cbs;
      CBS_init(&cbs, buf_u8, len);
      uint8_t type;
      uint32_t msg_len;
      if (!CBS_get_u8(&cbs, &type) ||
          // TODO(davidben): Reporting on entire messages would be more
          // consistent than fragments.
          (config->is_dtls &&
           !CBS_skip(&cbs, 3 /* total */ + 2 /* seq */ + 3 /* frag_off */)) ||
          !CBS_get_u24(&cbs, &msg_len) || !CBS_skip(&cbs, msg_len) ||
          CBS_len(&cbs) != 0) {
        fprintf(stderr, "Could not parse handshake message.\n");
        state->msg_callback_ok = false;
        return;
      }
      char text[16];
      if (content_type == SSL3_RT_CLIENT_HELLO_INNER) {
        if (type != SSL3_MT_CLIENT_HELLO) {
          fprintf(stderr, "Invalid header for ClientHelloInner.\n");
          state->msg_callback_ok = false;
          return;
        }
        state->msg_callback_text += "clienthelloinner\n";
      } else {
        snprintf(text, sizeof(text), "hs %d\n", type);
        state->msg_callback_text += text;
        if (!is_write) {
          state->last_message_received = type;
        }
      }
      return;
    }

    case SSL3_RT_CHANGE_CIPHER_SPEC:
      if (len != 1 || buf_u8[0] != 1) {
        fprintf(stderr, "Invalid ChangeCipherSpec.\n");
        state->msg_callback_ok = false;
        return;
      }
      state->msg_callback_text += "ccs\n";
      return;

    case SSL3_RT_ALERT:
      if (len != 2) {
        fprintf(stderr, "Invalid alert.\n");
        state->msg_callback_ok = false;
        return;
      }
      char text[16];
      snprintf(text, sizeof(text), "alert %d %d\n", buf_u8[0], buf_u8[1]);
      state->msg_callback_text += text;
      return;

    case SSL3_RT_ACK:
      state->msg_callback_text += "ack\n";
      return;

    default:
      fprintf(stderr, "Invalid content_type: %d.\n", content_type);
      state->msg_callback_ok = false;
  }
}